

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifndef_guard.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::IfdefGuardPrinter::IfdefGuardPrinter
          (IfdefGuardPrinter *this,Printer *p,string_view filename,
          AnyInvocable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
          *make_ifdef_identifier)

{
  Printer *this_00;
  Printer **ppPVar1;
  Arg *a0;
  string_view text;
  string_view format;
  string local_88;
  Printer *p_local;
  size_type local_60;
  pointer local_58;
  
  a0 = (Arg *)make_ifdef_identifier;
  p_local = p;
  ppPVar1 = absl::lts_20240722::log_internal::DieIfNull<google::protobuf::io::Printer*const&>
                      ("/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/cpp/ifndef_guard.cc"
                       ,0x2f,"p",&p_local);
  this->p_ = *ppPVar1;
  absl::lts_20240722::internal_any_invocable::
  Impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator()(&this->ifdef_identifier_,
               &make_ifdef_identifier->
                super_Impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
               ,filename);
  this_00 = p_local;
  local_58 = (this->ifdef_identifier_)._M_dataplus._M_p;
  local_60 = (this->ifdef_identifier_)._M_string_length;
  format._M_str = (char *)&local_60;
  format._M_len = (size_t)"#ifndef $0\n#define $0\n\n";
  absl::lts_20240722::Substitute_abi_cxx11_(&local_88,(lts_20240722 *)0x17,format,a0);
  text._M_str = local_88._M_dataplus._M_p;
  text._M_len = local_88._M_string_length;
  io::Printer::Print<>(this_00,text);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

IfdefGuardPrinter::IfdefGuardPrinter(
    google::protobuf::io::Printer* const p, const absl::string_view filename,
    absl::AnyInvocable<std::string(absl::string_view)> make_ifdef_identifier)
    : p_(ABSL_DIE_IF_NULL(p)),
      ifdef_identifier_(make_ifdef_identifier(filename)) {
  // We can't use variable substitution, because we don't know what delimiter
  // to use.
  p->Print(absl::Substitute(
      R"(#ifndef $0
#define $0

)",
      ifdef_identifier_));
}